

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandIndcut(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pNtk_00;
  char *pcVar2;
  uint local_8c;
  int c;
  int fVeryVerbose;
  int fVerbose;
  int fTarget;
  int fRegs;
  int fBmc;
  int fStepUp;
  int nBatches;
  int nCutsMax;
  int nLevels;
  int nLutSize;
  int nClauses;
  int nPref;
  int nFrames;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pNtk_00 = Abc_FrameReadNtk(pAbc);
  nClauses = 1;
  nLutSize = 0;
  nLevels = 5000;
  nCutsMax = 4;
  nBatches = 8;
  fStepUp = 0x10;
  fBmc = 1;
  fRegs = 0;
  fTarget = 1;
  fVerbose = 1;
  fVeryVerbose = 1;
  c = 0;
  local_8c = 0;
  Extra_UtilGetoptReset();
LAB_00296dd1:
  do {
    iVar1 = Extra_UtilGetopt(argc,argv,"FPCMLNBsbrtvwh");
    if (iVar1 == -1) {
      if (pNtk_00 == (Abc_Ntk_t *)0x0) {
        Abc_Print(-1,"Empty network.\n");
        return 1;
      }
      iVar1 = Abc_NtkIsComb(pNtk_00);
      if (iVar1 != 0) {
        Abc_Print(-1,"The network is combinational.\n");
        return 0;
      }
      iVar1 = Abc_NtkIsStrash(pNtk_00);
      if (iVar1 == 0) {
        Abc_Print(-1,"Currently only works for structurally hashed circuits.\n");
        return 0;
      }
      if (0xc < nCutsMax) {
        Abc_Print(-1,"The cut size should be not exceed 12.\n");
        return 0;
      }
      Abc_NtkDarClau(pNtk_00,nClauses,nLutSize,nLevels,nCutsMax,nBatches,fStepUp,fBmc,fRegs,fTarget,
                     fVerbose,fVeryVerbose,c,local_8c);
      return 0;
    }
    switch(iVar1) {
    case 0x42:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-B\" should be followed by an integer.\n");
        goto LAB_0029724d;
      }
      fBmc = atoi(argv[globalUtilOptind]);
      iVar1 = fBmc;
      break;
    case 0x43:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-C\" should be followed by an integer.\n");
        goto LAB_0029724d;
      }
      nLevels = atoi(argv[globalUtilOptind]);
      iVar1 = nLevels;
      break;
    default:
      goto LAB_0029724d;
    case 0x46:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-F\" should be followed by an integer.\n");
        goto LAB_0029724d;
      }
      nClauses = atoi(argv[globalUtilOptind]);
      iVar1 = nClauses;
      break;
    case 0x4c:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-L\" should be followed by an integer.\n");
        goto LAB_0029724d;
      }
      nBatches = atoi(argv[globalUtilOptind]);
      iVar1 = nBatches;
      break;
    case 0x4d:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-K\" should be followed by an integer.\n");
        goto LAB_0029724d;
      }
      nCutsMax = atoi(argv[globalUtilOptind]);
      iVar1 = nCutsMax;
      break;
    case 0x4e:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-N\" should be followed by an integer.\n");
        goto LAB_0029724d;
      }
      fStepUp = atoi(argv[globalUtilOptind]);
      iVar1 = fStepUp;
      break;
    case 0x50:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-P\" should be followed by an integer.\n");
        goto LAB_0029724d;
      }
      nLutSize = atoi(argv[globalUtilOptind]);
      iVar1 = nLutSize;
      break;
    case 0x62:
      fTarget = fTarget ^ 1;
      goto LAB_00296dd1;
    case 0x68:
      goto LAB_0029724d;
    case 0x72:
      fVerbose = fVerbose ^ 1;
      goto LAB_00296dd1;
    case 0x73:
      fRegs = fRegs ^ 1;
      goto LAB_00296dd1;
    case 0x74:
      fVeryVerbose = fVeryVerbose ^ 1;
      goto LAB_00296dd1;
    case 0x76:
      c = c ^ 1;
      goto LAB_00296dd1;
    case 0x77:
      local_8c = local_8c ^ 1;
      goto LAB_00296dd1;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if (iVar1 < 0) {
LAB_0029724d:
      Abc_Print(-2,"usage: indcut [-FPCMLNB num] [-sbrtvh]\n");
      Abc_Print(-2,"\t         K-step induction strengthened with cut properties\n");
      Abc_Print(-2,"\t-F num : number of time frames for induction (1=simple) [default = %d]\n",
                (ulong)(uint)nClauses);
      Abc_Print(-2,"\t-P num : number of time frames in the prefix (0=no prefix) [default = %d]\n",
                (ulong)(uint)nLutSize);
      Abc_Print(-2,"\t-C num : the max number of clauses to use for strengthening [default = %d]\n",
                (ulong)(uint)nLevels);
      Abc_Print(-2,"\t-M num : the cut size (2 <= M <= 12) [default = %d]\n",(ulong)(uint)nCutsMax);
      Abc_Print(-2,"\t-L num : the max number of levels for cut computation [default = %d]\n",
                (ulong)(uint)nBatches);
      Abc_Print(-2,"\t-N num : the max number of cuts to compute at a node [default = %d]\n",
                (ulong)(uint)fStepUp);
      Abc_Print(-2,"\t-B num : the max number of invariant batches to try [default = %d]\n",
                (ulong)(uint)fBmc);
      pcVar2 = "no";
      if (fRegs != 0) {
        pcVar2 = "yes";
      }
      Abc_Print(-2,"\t-s     : toggle increment cut size in each batch [default = %s]\n",pcVar2);
      pcVar2 = "no";
      if (fTarget != 0) {
        pcVar2 = "yes";
      }
      Abc_Print(-2,"\t-b     : toggle enabling BMC check [default = %s]\n",pcVar2);
      pcVar2 = "no";
      if (fVerbose != 0) {
        pcVar2 = "yes";
      }
      Abc_Print(-2,"\t-r     : toggle enabling register clauses [default = %s]\n",pcVar2);
      pcVar2 = "no";
      if (fVeryVerbose != 0) {
        pcVar2 = "yes";
      }
      Abc_Print(-2,"\t-t     : toggle proving target / computing don\'t-cares [default = %s]\n",
                pcVar2);
      pcVar2 = "no";
      if (c != 0) {
        pcVar2 = "yes";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar2);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandIndcut( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int nFrames;
    int nPref;
    int nClauses;
    int nLutSize;
    int nLevels;
    int nCutsMax;
    int nBatches;
    int fStepUp;
    int fBmc;
    int fRegs;
    int fTarget;
    int fVerbose;
    int fVeryVerbose;
    int c;
    extern int Abc_NtkDarClau( Abc_Ntk_t * pNtk, int nFrames, int nPref, int nClauses, int nLutSize, int nLevels, int nCutsMax, int nBatches, int fStepUp, int fBmc, int fRegs, int fTarget, int fVerbose, int fVeryVerbose );
    // set defaults
    nFrames      =    1;
    nPref        =    0;
    nClauses     = 5000;
    nLutSize     =    4;
    nLevels      =    8;
    nCutsMax     =   16;
    nBatches     =    1;
    fStepUp      =    0;
    fBmc         =    1;
    fRegs        =    1;
    fTarget      =    1;
    fVerbose     =    0;
    fVeryVerbose =    0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "FPCMLNBsbrtvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            nFrames = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nFrames < 0 )
                goto usage;
            break;
        case 'P':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-P\" should be followed by an integer.\n" );
                goto usage;
            }
            nPref = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nPref < 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            nClauses = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nClauses < 0 )
                goto usage;
            break;
        case 'M':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-K\" should be followed by an integer.\n" );
                goto usage;
            }
            nLutSize = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nLutSize < 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            nLevels = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nLevels < 0 )
                goto usage;
            break;
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            nCutsMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nCutsMax < 0 )
                goto usage;
            break;
        case 'B':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-B\" should be followed by an integer.\n" );
                goto usage;
            }
            nBatches = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nBatches < 0 )
                goto usage;
            break;
        case 's':
            fStepUp ^= 1;
            break;
        case 'b':
            fBmc ^= 1;
            break;
        case 'r':
            fRegs ^= 1;
            break;
        case 't':
            fTarget ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'w':
            fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( Abc_NtkIsComb(pNtk) )
    {
        Abc_Print( -1, "The network is combinational.\n" );
        return 0;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "Currently only works for structurally hashed circuits.\n" );
        return 0;
    }
    if ( nLutSize > 12 )
    {
        Abc_Print( -1, "The cut size should be not exceed 12.\n" );
        return 0;
    }
    Abc_NtkDarClau( pNtk, nFrames, nPref, nClauses, nLutSize, nLevels, nCutsMax, nBatches, fStepUp, fBmc, fRegs, fTarget, fVerbose, fVeryVerbose );
    return 0;
usage:
    Abc_Print( -2, "usage: indcut [-FPCMLNB num] [-sbrtvh]\n" );
    Abc_Print( -2, "\t         K-step induction strengthened with cut properties\n" );
    Abc_Print( -2, "\t-F num : number of time frames for induction (1=simple) [default = %d]\n", nFrames );
    Abc_Print( -2, "\t-P num : number of time frames in the prefix (0=no prefix) [default = %d]\n", nPref );
    Abc_Print( -2, "\t-C num : the max number of clauses to use for strengthening [default = %d]\n", nClauses );
    Abc_Print( -2, "\t-M num : the cut size (2 <= M <= 12) [default = %d]\n", nLutSize );
    Abc_Print( -2, "\t-L num : the max number of levels for cut computation [default = %d]\n", nLevels );
    Abc_Print( -2, "\t-N num : the max number of cuts to compute at a node [default = %d]\n", nCutsMax );
    Abc_Print( -2, "\t-B num : the max number of invariant batches to try [default = %d]\n", nBatches );
    Abc_Print( -2, "\t-s     : toggle increment cut size in each batch [default = %s]\n", fStepUp? "yes": "no" );
    Abc_Print( -2, "\t-b     : toggle enabling BMC check [default = %s]\n", fBmc? "yes": "no" );
    Abc_Print( -2, "\t-r     : toggle enabling register clauses [default = %s]\n", fRegs? "yes": "no" );
    Abc_Print( -2, "\t-t     : toggle proving target / computing don't-cares [default = %s]\n", fTarget? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
//    Abc_Print( -2, "\t-w     : toggle printing very verbose information [default = %s]\n", fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}